

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O0

void __thiscall
Centaurus::Grammar<wchar_t>::print_catn(Grammar<wchar_t> *this,wostream *os,Identifier *id)

{
  CATNMachine<wchar_t> *this_00;
  wstring *name;
  undefined1 local_68 [8];
  CompositeATN<wchar_t> catn;
  Identifier *id_local;
  wostream *os_local;
  Grammar<wchar_t> *this_local;
  
  catn.m_dict._M_h._M_single_bucket = (__node_base_ptr)id;
  CompositeATN<wchar_t>::CompositeATN((CompositeATN<wchar_t> *)local_68,this);
  this_00 = CompositeATN<wchar_t>::operator[]
                      ((CompositeATN<wchar_t> *)local_68,
                       (Identifier *)catn.m_dict._M_h._M_single_bucket);
  name = Identifier::str_abi_cxx11_((Identifier *)catn.m_dict._M_h._M_single_bucket);
  CATNMachine<wchar_t>::print(this_00,os,name);
  CompositeATN<wchar_t>::~CompositeATN((CompositeATN<wchar_t> *)local_68);
  return;
}

Assistant:

void Grammar<TCHAR>::print_catn(std::wostream& os, const Identifier& id) const
{
    CompositeATN<TCHAR> catn(*this);

    catn[id].print(os, id.str());
}